

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

shared_ptr<Pipeline> __thiscall QPDFLogger::getWarn(QPDFLogger *this,bool null_okay)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined7 in_register_00000031;
  shared_ptr<Pipeline> sVar4;
  bool null_okay_local;
  QPDFLogger *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT71(in_register_00000031,null_okay));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->p_warn);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT71(in_register_00000031,null_okay));
    std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)this,&peVar2->p_warn);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    sVar4 = getError(this,null_okay);
    _Var3 = sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getWarn(bool null_okay)
{
    if (m->p_warn) {
        return m->p_warn;
    }
    return getError(null_okay);
}